

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void SerializeMany<VectorWriter,int,unsigned_long,long,unsigned_long,ParamsWrapper<CAddress::SerParams,CService_const>>
               (VectorWriter *s,int *args,unsigned_long *args_1,long *args_2,unsigned_long *args_3,
               ParamsWrapper<CAddress::SerParams,_const_CService> *args_4)

{
  long *__n;
  long in_FS_OFFSET;
  unsigned_long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = CONCAT44(local_40._4_4_,*args);
  __n = args_2;
  VectorWriter::write(s,(int)&local_40,(void *)0x4,(size_t)args_2);
  local_40 = *args_1;
  VectorWriter::write(s,(int)&local_40,&DAT_00000008,(size_t)__n);
  local_40 = *args_2;
  VectorWriter::write(s,(int)&local_40,&DAT_00000008,(size_t)__n);
  local_40 = *args_3;
  VectorWriter::write(s,(int)&local_40,&DAT_00000008,(size_t)__n);
  ParamsWrapper<CAddress::SerParams,_const_CService>::Serialize<VectorWriter>(args_4,s);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}